

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O2

void dspl_Render(ECommand_t activeCmd)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  SolStack_t *pSVar4;
  SolStack_t *stackPtr;
  size_t sVar5;
  WINDOW *win;
  char *pcVar6;
  int y;
  int y_00;
  int y_01;
  ECardFace_t *pEVar7;
  int x;
  ECommand_t cmd;
  int iVar8;
  int iVar9;
  long lVar10;
  uint x_00;
  int iVar11;
  int i;
  long lVar12;
  ECardFace_t *pEVar13;
  ulong uVar14;
  Card_t card;
  Card_t card_00;
  
  werase(_stdscr);
  pSVar4 = tbl_GetColorStacks();
  cmd = CMD_COLOR0;
  lVar10 = 0;
  for (lVar12 = 0; lVar12 != 0x28; lVar12 = lVar12 + 10) {
    x_00 = (uint)lVar12 | 0x20;
    DrawCmdLabel(cmd,x_00,8);
    DrawTopCard(pSVar4,(uint)lVar12 + 0x1f,y);
    if (lVar10 + 7U == (ulong)activeCmd) {
      DrawLabel("sel",x_00,3);
    }
    lVar10 = lVar10 + 1;
    pSVar4 = pSVar4 + 1;
    cmd = cmd + CMD_EXIT;
  }
  pSVar4 = tbl_GetPack();
  stackPtr = tbl_GetRest();
  DrawCmdLabel(CMD_NEXT,2,8);
  DrawTopCard(pSVar4,1,y_00);
  DrawCmdLabel(CMD_PACK,0xc,8);
  DrawTopCard(stackPtr,0xb,y_01);
  if (activeCmd == CMD_PACK) {
    DrawLabel("sel",0xc,3);
  }
  pSVar4 = tbl_GetDeskStacks();
  pEVar13 = &pSVar4->m_cards[0].m_face;
  for (lVar10 = 0; iVar8 = 1, lVar10 != 7; lVar10 = lVar10 + 1) {
    iVar11 = (int)lVar10 * 10;
    iVar8 = iVar11 + 2;
    DrawCmdLabel((int)lVar10 + CMD_DESK0,iVar8,0xc);
    iVar11 = iVar11 + 1;
    if (pSVar4[lVar10].m_size == 0) {
      DrawEmptyGrid(iVar11,0xd);
    }
    iVar9 = 0xd;
    pEVar7 = pEVar13;
    for (uVar14 = 0; uVar14 < pSVar4[lVar10].m_size; uVar14 = uVar14 + 1) {
      uVar1 = ((Card_t *)(pEVar7 + -2))->m_type;
      uVar2 = ((Card_t *)(pEVar7 + -2))->m_color;
      card.m_color = uVar2;
      card.m_type = uVar1;
      card.m_face = *pEVar7;
      DrawFullCard(card,iVar11,iVar9);
      iVar9 = iVar9 + 2;
      pEVar7 = pEVar7 + 3;
    }
    if (lVar10 + 0xbU == (ulong)activeCmd) {
      DrawLabel("sel",iVar8,(int)pSVar4[lVar10].m_size * 2 + 0xd);
    }
    pEVar13 = pEVar13 + 0x9e;
  }
  if (FlyingCard.m_enabled == true) {
    card_00.m_face = FlyingCard.m_card.m_face;
    card_00.m_type = FlyingCard.m_card.m_type;
    card_00.m_color = FlyingCard.m_card.m_color;
    DrawFullCard(card_00,FlyingCard.m_x,FlyingCard.m_y);
  }
  if (_stdscr == 0) {
    iVar9 = -1;
    iVar11 = -2;
  }
  else {
    iVar11 = (int)*(short *)(_stdscr + 6);
    iVar9 = *(short *)(_stdscr + 4) + 1;
  }
  wattr_on(_stdscr,0x600,0);
  while( true ) {
    lVar10 = _stdscr;
    if (iVar11 <= iVar8) break;
    iVar3 = wmove(_stdscr,iVar9 + -2,iVar8);
    if (iVar3 != -1) {
      waddch(_stdscr,0x20);
    }
    iVar8 = iVar8 + 1;
  }
  iVar8 = dd_GetHighScore();
  iVar3 = tbl_GetCurrentScore();
  mvwprintw(lVar10,iVar9 + -2,2,"High Score: %-5d   Your Score: %-5d",iVar8,iVar3);
  DrawRectangle(0,iVar9 + -3,iVar11,2);
  wattr_off(_stdscr,0x600,0);
  pcVar6 = Message;
  if (*Message != '\0') {
    sVar5 = strlen(Message);
    DrawLabel(pcVar6,0x21 - (int)(sVar5 >> 1),9);
  }
  wrefresh(_stdscr);
  if (activeCmd == CMD_HELP) {
    win = (WINDOW *)newwin(0x14,0x37,3,8);
    wbkgd(win,0x500);
    wattr_on(win,0x500,0);
    pcVar6 = ctrl_GetHelp();
    mvwprintw(win,1,0,"%s",pcVar6);
    DrawRectangleInWindow(win,0,0,0x36,0x13);
    wattr_off(win,0x500,0);
    wrefresh(win);
    return;
  }
  return;
}

Assistant:

void dspl_Render(ECommand_t activeCmd)
{
  erase();
  DisplayColors(activeCmd);
  DisplayPack(activeCmd);
  DisplayDesk(activeCmd);
  DisplayFlying();
  DisplayStats();

  if (Message[0] != '\0') {
    DisplayMessage();
  }

  refresh();
  if (activeCmd == CMD_HELP) {
    DisplayHelp();
  }
}